

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O2

Scope * __thiscall flow::lang::Lexer::enterScope(Lexer *this,string *filename)

{
  int __v;
  pointer __p;
  Scope *pSVar1;
  system_error *this_00;
  int *piVar2;
  error_category *__ecat;
  pointer *__ptr;
  string *local_28;
  _Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false> local_20;
  
  std::make_unique<std::ifstream>();
  std::ifstream::open(local_28,(_Ios_Openmode)filename);
  if (*(int *)(local_28 + 0x20 + *(long *)(*(long *)local_28 + -0x18)) != 0) {
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    piVar2 = __errno_location();
    __v = *piVar2;
    __ecat = (error_category *)std::_V2::system_category();
    std::system_error::system_error(this_00,__v,__ecat);
    __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  local_20._M_head_impl = (basic_istream<char,_std::char_traits<char>_> *)local_28;
  pSVar1 = enterScope(this,(unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                            *)&local_20,filename);
  if (local_20._M_head_impl != (basic_istream<char,_std::char_traits<char>_> *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  return pSVar1;
}

Assistant:

Lexer::Scope* Lexer::enterScope(const std::string& filename) {
  auto ifs = std::make_unique<std::ifstream>();

  ifs->open(filename);
  if (!ifs->good())
    throw std::system_error(errno, std::system_category());

  return enterScope(std::move(ifs), filename);
}